

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_overlap(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t light;
  wchar_t y2;
  wchar_t x1;
  wchar_t y2_00;
  int iVar8;
  int iVar9;
  wchar_t x2;
  wchar_t x1_00;
  int iVar10;
  wchar_t x2_00;
  int iVar11;
  wchar_t y1;
  wchar_t y1_00;
  wchar_t y2_01;
  wchar_t x2_01;
  int iVar12;
  wchar_t y1_01;
  wchar_t x1_01;
  int iVar13;
  wchar_t y2_02;
  int iVar14;
  wchar_t wVar15;
  int iVar16;
  wchar_t wVar17;
  loc_conflict centre_local;
  
  wVar6 = c->depth;
  centre_local = centre;
  uVar2 = Rand_div(0x19);
  uVar3 = Rand_div(4);
  iVar10 = uVar3 + 1;
  uVar3 = Rand_div(0xb);
  iVar4 = uVar3 + 1;
  uVar3 = Rand_div(3);
  iVar14 = uVar3 + 1;
  uVar3 = Rand_div(10);
  iVar16 = uVar3 + 1;
  uVar3 = Rand_div(3);
  iVar11 = uVar3 + 1;
  uVar3 = Rand_div(10);
  iVar12 = uVar3 + 1;
  uVar3 = Rand_div(4);
  iVar13 = uVar3 + 1;
  uVar3 = Rand_div(0xb);
  iVar8 = uVar3 + 1;
  iVar5 = iVar14;
  if (iVar14 < iVar10) {
    iVar5 = iVar10;
  }
  iVar7 = iVar13;
  if (iVar13 < iVar11) {
    iVar7 = iVar11;
  }
  if (iVar7 < iVar5) {
    iVar7 = iVar5;
  }
  iVar5 = iVar16;
  if (iVar16 < iVar4) {
    iVar5 = iVar4;
  }
  iVar9 = iVar8;
  if (iVar8 < iVar12) {
    iVar9 = iVar12;
  }
  if (iVar9 < iVar5) {
    iVar9 = iVar5;
  }
  wVar15 = iVar7 * 2 + L'\x03';
  wVar17 = iVar9 * 2 + L'\x03';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar15,wVar17);
  if (((c->height <= centre_local.y) || (c->width <= centre_local.x)) &&
     (_Var1 = find_space(&centre_local,wVar15,wVar17), !_Var1)) {
    return false;
  }
  light = (wchar_t)(wVar6 <= uVar2 + L'\x01');
  iVar5 = centre_local.x;
  iVar7 = centre_local.y;
  wVar6 = centre_local.y - iVar10;
  wVar15 = centre_local.x - iVar4;
  y2 = centre_local.y + iVar14;
  x2 = centre_local.x + iVar16;
  y1_01 = centre_local.y - iVar11;
  x1 = centre_local.x - iVar12;
  y1 = wVar6 + L'\xffffffff';
  x1_00 = wVar15 + L'\xffffffff';
  y2_01 = centre_local.y + iVar13;
  y2_00 = centre_local.y + iVar14 + L'\x01';
  wVar17 = centre_local.x + iVar8;
  x2_01 = iVar16 + centre_local.x + L'\x01';
  generate_room(c,y1,x1_00,y2_00,x2_01,light);
  y1_00 = y1_01 + L'\xffffffff';
  x1_01 = x1 + L'\xffffffff';
  y2_02 = iVar13 + iVar7 + L'\x01';
  x2_00 = iVar5 + 1 + iVar8;
  generate_room(c,y1_00,x1_01,y2_02,x2_00,light);
  draw_rectangle(c,y1,x1_00,y2_00,x2_01,FEAT_GRANITE,L'\f',false);
  draw_rectangle(c,y1_00,x1_01,y2_02,x2_00,FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar6,wVar15,y2,x2,FEAT_FLOOR,L'\0');
  fill_rectangle(c,y1_01,x1,y2_01,wVar17,FEAT_FLOOR,L'\0');
  return true;
}

Assistant:

bool build_overlap(struct chunk *c, struct loc centre, int rating)
{
	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;
	int height, width;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Determine extents of room (a) */
	y1a = randint1(4);
	x1a = randint1(11);
	y2a = randint1(3);
	x2a = randint1(10);

	/* Determine extents of room (b) */
	y1b = randint1(3);
	x1b = randint1(10);
	y2b = randint1(4);
	x2b = randint1(11);

	/* Calculate height and width */
	height = 2 * MAX(MAX(y1a, y2a), MAX(y1b, y2b)) + 1;
	width = 2 * MAX(MAX(x1a, x2a), MAX(x1b, x2b)) + 1;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (a) */
	y1a = centre.y - y1a;
	x1a = centre.x - x1a;
	y2a = centre.y + y2a;
	x2a = centre.x + x2a;

	/* locate room (b) */
	y1b = centre.y - y1b;
	x1b = centre.x - x1b;
	y2b = centre.y + y2b;
	x2b = centre.x + x2b;

	/* Generate new room (a) */
	generate_room(c, y1a-1, x1a-1, y2a+1, x2a+1, light);

	/* Generate new room (b) */
	generate_room(c, y1b-1, x1b-1, y2b+1, x2b+1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a-1, x1a-1, y2a+1, x2a+1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b-1, x1b-1, y2b+1, x2b+1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	return true;
}